

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_hb_timeout(raft_server *this,int32 srv_id)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  context *pcVar5;
  bool bVar6;
  int iVar7;
  uint64_t uVar8;
  iterator iVar9;
  undefined4 extraout_var;
  Param param;
  uint64_t last_log_idx;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_b0 [36];
  key_type_conflict local_8c;
  int32 local_88;
  __int_type_conflict1 _Stack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 local_70;
  _Alloc_hider local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined8 local_58;
  undefined8 local_50;
  _Alloc_hider local_48;
  Type local_3c;
  undefined8 local_38;
  undefined1 local_30;
  
  local_38 = &this->lock_;
  local_30 = false;
  local_8c = srv_id;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffc8);
  local_30 = true;
  check_srv_to_leave_timeout(this);
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    bVar6 = timer_helper::timeout(&this->reelection_timer_);
    if (bVar6) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar8 = timer_helper::get_us(&this->reelection_timer_);
        msg_if_given_abi_cxx11_
                  ((string *)local_b0,"resign by timeout, %lu us elapsed, resign now",uVar8);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x40,local_b0);
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      LOCK();
      (this->leader_).super___atomic_base<int>._M_i = -1;
      UNLOCK();
      become_follower(this);
      LOCK();
      (this->hb_alive_)._M_base._M_i = false;
      UNLOCK();
      goto LAB_00227f68;
    }
  }
  if (((((this->srv_to_join_snp_retry_required_)._M_base._M_i & 1U) == 0) ||
      (peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar3 == (element_type *)0x0)) ||
     (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->id_ != local_8c)) {
    iVar9 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&local_8c);
    if (iVar9.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 1 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_b0,"heartbeat handler error: server %d not exist",
                   (ulong)(uint)local_8c);
        (*peVar2->_vptr_logger[8])
                  (peVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x69,local_b0);
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      goto LAB_00227f68;
    }
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                     ._M_cur + 0x10);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)iVar9.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                      ._M_cur + 0x18);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if ((p_Var4[0x1d]._M_weak_count & 1) != 0) {
      LOCK();
      *(int *)&p_Var4[0x1e]._vptr__Sp_counted_base =
           *(int *)&p_Var4[0x1e]._vptr__Sp_counted_base + 1;
      UNLOCK();
      uVar1 = *(uint *)&p_Var4[0x1e]._vptr__Sp_counted_base;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_b0,"peer %d is not responding for %d HBs since leave request",
                   (ulong)*(uint *)p_Var4->_vptr__Sp_counted_base,(ulong)uVar1);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x76,local_b0);
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      if (DAT_00638a14 <= (int)uVar1) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 1 < iVar7)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_b0,"force remove peer %d",
                     (ulong)*(uint *)p_Var4->_vptr__Sp_counted_base);
          (*peVar2->_vptr_logger[8])
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x7a,local_b0);
          if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_50 = p_Var4;
        local_48._M_p = (pointer)this_00;
        handle_join_leave_rpc_err(this,leave_cluster_request,(ptr<peer> *)&stack0xffffffffffffffb0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_p);
        }
        goto joined_r0x00227f5e;
      }
    }
    local_88 = this->id_;
    _Stack_84 = (this->leader_).super___atomic_base<int>._M_i;
    local_80 = *(undefined4 *)p_Var4->_vptr__Sp_counted_base;
    local_78 = (element_type *)0x0;
    iVar7 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    local_70 = CONCAT44(extraout_var,iVar7) + -1;
    local_78 = &stack0xffffffffffffff90;
    pcVar5 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    if ((pcVar5->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_3c = HeartBeat;
      local_b0._0_8_ = &stack0xffffffffffffff78;
      (*(pcVar5->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar5->cb_func_,&stack0xffffffffffffffc4,(Param **)local_b0);
    }
    if (((this->stopping_)._M_base._M_i & 1U) == 0) {
      bVar6 = check_leadership_validity(this);
      if (bVar6) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_b0,"heartbeat timeout for %d",
                     (ulong)*(uint *)p_Var4->_vptr__Sp_counted_base);
          (*peVar2->_vptr_logger[8])
                    (peVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x8e,local_b0);
          if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_);
          }
        }
        if ((this->role_)._M_i == leader) {
          update_target_priority(this);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_60._M_pi = p_Var4;
          local_58 = this_00;
          request_append_entries(this,(ptr<peer> *)&stack0xffffffffffffffa0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
          }
          iVar7 = pthread_mutex_lock((pthread_mutex_t *)&p_Var4[0xd]._M_use_count);
          if (iVar7 != 0) {
            std::__throw_system_error(iVar7);
          }
          if (*(char *)((long)&p_Var4[8]._M_use_count + 2) == '\x01') {
            schedule_task(this,(ptr<delayed_task> *)(p_Var4 + 9),p_Var4[5]._M_use_count);
          }
          else {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 4 < iVar7)
               ) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)local_b0,"heartbeat is disabled for peer %d",
                         (ulong)*(uint *)p_Var4->_vptr__Sp_counted_base);
              (*peVar2->_vptr_logger[8])
                        (peVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_hb_timeout",0x98,local_b0);
              if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_);
              }
            }
          }
          pthread_mutex_unlock((pthread_mutex_t *)&p_Var4[0xd]._M_use_count);
        }
        else {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 2 < iVar7))
          {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_b0,
                       "Receive a heartbeat event for %d while no longer as a leader",
                       (ulong)*(uint *)p_Var4->_vptr__Sp_counted_base);
            (*peVar2->_vptr_logger[8])
                      (peVar2,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_hb_timeout",0x9d,local_b0);
            goto LAB_00227b55;
          }
        }
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 2 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_b0,"Triggered HB timer but server is shutting down")
        ;
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x88,local_b0);
LAB_00227b55:
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
    }
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_b0,"retrying snapshot read for server %d",(ulong)(uint)local_8c);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"handle_hb_timeout",0x4c,local_b0);
      if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    bVar6 = peer::need_to_reconnect
                      ((this->srv_to_join_).
                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (!bVar6) {
LAB_00227904:
      sync_log_to_new_srv(this,0);
      goto LAB_00227f68;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_b0,"rpc client for %d needs reconnection",(ulong)(uint)local_8c);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"handle_hb_timeout",0x4e,local_b0);
      if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    context::get_params((context *)&stack0xffffffffffffff78);
    uVar8 = timer_helper::get_us
                      (&((this->srv_to_join_).
                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        last_resp_timer_);
    if (uVar8 / 1000 <
        (ulong)((long)DAT_00638a08 * (long)*(int *)(CONCAT44(_Stack_84,local_88) + 8))) {
      srv_config::serialize((srv_config *)local_b0);
      srv_config::deserialize((srv_config *)&stack0xffffffffffffff90,(buffer *)local_b0._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
      }
      bVar6 = peer::recreate_rpc((this->srv_to_join_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 ,(ptr<srv_config> *)&stack0xffffffffffffff90,
                                 (this->ctx_)._M_t.
                                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                 .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
      if (bVar6) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,local_80) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,local_80));
        }
        goto LAB_00227904;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 2 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_b0,"reconnection failed, will not retry");
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x5e,local_b0);
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      clear_snapshot_sync_ctx
                (this,(this->srv_to_join_).
                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p);
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 3 < iVar7)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_b0,"response timeout: %lu ms, will not retry",uVar8 / 1000);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x54,local_b0);
        if ((buffer *)local_b0._0_8_ != (buffer *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      clear_snapshot_sync_ctx
                (this,(this->srv_to_join_).
                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,local_80);
  }
joined_r0x00227f5e:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00227f68:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void raft_server::handle_hb_timeout(int32 srv_id) {
    recur_lock(lock_);

    check_srv_to_leave_timeout();

    if (write_paused_ && reelection_timer_.timeout()) {
        p_in("resign by timeout, %" PRIu64 " us elapsed, resign now",
             reelection_timer_.get_us());
        leader_ = -1;
        become_follower();

        // Clear this flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    if ( srv_to_join_snp_retry_required_ &&
         srv_to_join_ &&
         srv_to_join_->get_id() == srv_id ) {
        p_in("retrying snapshot read for server %d", srv_id);
        if (srv_to_join_->need_to_reconnect()) {
            p_in("rpc client for %d needs reconnection", srv_id);

            ptr<raft_params> params = ctx_->get_params();
            uint64_t resp_timer_ms = srv_to_join_->get_resp_timer_us() / 1000;
            if ( resp_timer_ms >= (uint64_t)params->heart_beat_interval_ *
                                  raft_server::raft_limits_.response_limit_ ) {
                p_in("response timeout: %" PRIu64 " ms, will not retry", resp_timer_ms);
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }

            ptr<srv_config> s_config =
                srv_config::deserialize( *srv_to_join_->get_config().serialize() );
            bool succ = srv_to_join_->recreate_rpc(s_config, *ctx_);
            if (!succ) {
                // Reconnection failed.
                p_wn("reconnection failed, will not retry");
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }
        }
        sync_log_to_new_srv(0);
        return;
    }

    auto pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_er("heartbeat handler error: server %d not exist", srv_id);
        return;
    }

    // To avoid freeing this pointer in the middle of this function.
    ptr<peer> p = pit->second;

    if (p->is_leave_flag_set()) {
        // Leave request has been sent but not removed yet,
        // increase the counter.
        p->inc_hb_cnt_since_leave();
        int32 cur_cnt = p->get_hb_cnt_since_leave();
        p_in("peer %d is not responding for %d HBs since leave request",
             p->get_id(), cur_cnt);

        if (cur_cnt >= raft_server::raft_limits_.leave_limit_) {
            // Force remove the server.
            p_er("force remove peer %d", p->get_id());
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, p);
            return;
        }
    }

    cb_func::Param param(id_, leader_, p->get_id());
    uint64_t last_log_idx = log_store_->next_slot() - 1;
    param.ctx = &last_log_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::HeartBeat, &param);
    (void)rc;

    // Server is being shut down.
    if (stopping_) {
        p_wn("Triggered HB timer but server is shutting down");
        return;
    }

    if (!check_leadership_validity()) return;

    p_db("heartbeat timeout for %d", p->get_id());
    if (role_ == srv_role::leader) {
        update_target_priority();
        request_append_entries(p);
        {
            std::lock_guard<std::mutex> guard(p->get_lock());
            if (p->is_hb_enabled()) {
                // Schedule another heartbeat if heartbeat is still enabled
                schedule_task(p->get_hb_task(), p->get_current_hb_interval());
            } else {
                p_db("heartbeat is disabled for peer %d", p->get_id());
            }
        }
    } else {
        p_wn("Receive a heartbeat event for %d "
             "while no longer as a leader", p->get_id());
    }
}